

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_query.cpp
# Opt level: O0

void __thiscall create::SerialQuery::requestSensorData(SerialQuery *this)

{
  size_t in_RCX;
  int in_R8D;
  SerialQuery *local_50;
  code *local_48;
  undefined8 local_40;
  type local_38;
  int local_1c;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_18;
  SerialQuery *local_10;
  SerialQuery *this_local;
  
  local_10 = this;
  flushInput(this);
  Serial::send(&this->super_Serial,0x1dddc0,(void *)0x2,in_RCX,in_R8D);
  local_1c = 0x32;
  boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
  subsecond_duration<int>(&local_18,&local_1c,(type *)0x0);
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_from_now(&this->streamRecoveryTimer,&local_18.super_time_duration);
  local_48 = restartSensorStream;
  local_40 = 0;
  local_50 = this;
  std::
  bind<void(create::SerialQuery::*)(boost::system::error_code_const&),create::SerialQuery*,std::_Placeholder<1>const&>
            (&local_38,(offset_in_SerialQuery_to_subr *)&local_48,&local_50,
             (_Placeholder<1> *)&std::placeholders::_1);
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,boost::asio::time_traits<boost::posix_time::ptime>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_wait<std::_Bind<void(create::SerialQuery::*(create::SerialQuery*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
            ((basic_deadline_timer<boost::posix_time::ptime,boost::asio::time_traits<boost::posix_time::ptime>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->streamRecoveryTimer,&local_38);
  return;
}

Assistant:

void SerialQuery::requestSensorData() {
    static const uint8_t requestPacket[2] = { OC_SENSORS, ID_GROUP_0 };
    // Prevents previous packet from corrupting next one
    flushInput();
    send(requestPacket, 2);
    // Automatically resend request if no response is received
    streamRecoveryTimer.expires_from_now(boost::posix_time::milliseconds(50));
    streamRecoveryTimer.async_wait(
      std::bind(&SerialQuery::restartSensorStream, this, std::placeholders::_1));
  }